

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

bool anon_unknown.dwarf_5c29f0::EncodeECPoint
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EC_GROUP *group,
               EC_POINT *p,point_conversion_form_t form)

{
  uchar *buf;
  size_t sVar1;
  bool bVar2;
  
  bVar2 = false;
  sVar1 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)p,POINT_CONVERSION_UNCOMPRESSED,
                             (uchar *)0x0,0,(BN_CTX *)0x0);
  if (sVar1 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,sVar1);
    buf = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    sVar1 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)p,POINT_CONVERSION_UNCOMPRESSED,buf,
                               (long)(out->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)buf,
                               (BN_CTX *)0x0);
    bVar2 = sVar1 == (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
  }
  return bVar2;
}

Assistant:

static bool EncodeECPoint(std::vector<uint8_t> *out, const EC_GROUP *group,
                          const EC_POINT *p, point_conversion_form_t form) {
  size_t len = EC_POINT_point2oct(group, p, form, nullptr, 0, nullptr);
  if (len == 0) {
    return false;
  }

  out->resize(len);
  len = EC_POINT_point2oct(group, p, form, out->data(), out->size(), nullptr);
  if (len != out->size()) {
    return false;
  }

  return true;
}